

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CivetServer.cpp
# Opt level: O3

vector<mg_server_port,_std::allocator<mg_server_port>_> * __thiscall
CivetServer::getListeningPortsFull
          (vector<mg_server_port,_std::allocator<mg_server_port>_> *__return_storage_ptr__,
          CivetServer *this)

{
  undefined8 *puVar1;
  mg_server_port *ports;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  uint uVar5;
  value_type *__val;
  pointer pmVar6;
  long lVar7;
  ulong uVar8;
  size_type __new_size;
  
  pmVar6 = (pointer)operator_new(0x100);
  (__return_storage_ptr__->super__Vector_base<mg_server_port,_std::allocator<mg_server_port>_>).
  _M_impl.super__Vector_impl_data._M_start = pmVar6;
  (__return_storage_ptr__->super__Vector_base<mg_server_port,_std::allocator<mg_server_port>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = pmVar6 + 8;
  pmVar6->protocol = 0;
  pmVar6->port = 0;
  pmVar6->is_ssl = 0;
  pmVar6->is_redirect = 0;
  pmVar6->_reserved1 = 0;
  pmVar6->_reserved2 = 0;
  pmVar6->_reserved3 = 0;
  pmVar6->_reserved4 = 0;
  lVar7 = 0x20;
  do {
    uVar2 = *(undefined8 *)pmVar6;
    uVar3 = *(undefined8 *)&pmVar6->is_ssl;
    uVar4 = *(undefined8 *)&pmVar6->_reserved3;
    puVar1 = (undefined8 *)((long)&pmVar6->_reserved1 + lVar7);
    *puVar1 = *(undefined8 *)&pmVar6->_reserved1;
    puVar1[1] = uVar4;
    puVar1 = (undefined8 *)((long)&pmVar6->protocol + lVar7);
    *puVar1 = uVar2;
    puVar1[1] = uVar3;
    lVar7 = lVar7 + 0x20;
  } while (lVar7 != 0x100);
  (__return_storage_ptr__->super__Vector_base<mg_server_port,_std::allocator<mg_server_port>_>).
  _M_impl.super__Vector_impl_data._M_finish = pmVar6 + 8;
  while( true ) {
    ports = (__return_storage_ptr__->
            super__Vector_base<mg_server_port,_std::allocator<mg_server_port>_>)._M_impl.
            super__Vector_impl_data._M_start;
    uVar5 = mg_get_server_ports(this->context,
                                (int)((ulong)((long)(__return_storage_ptr__->
                                                                                                        
                                                  super__Vector_base<mg_server_port,_std::allocator<mg_server_port>_>
                                                  )._M_impl.super__Vector_impl_data._M_finish -
                                             (long)ports) >> 5),ports);
    uVar8 = (long)(__return_storage_ptr__->
                  super__Vector_base<mg_server_port,_std::allocator<mg_server_port>_>)._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(__return_storage_ptr__->
                  super__Vector_base<mg_server_port,_std::allocator<mg_server_port>_>)._M_impl.
                  super__Vector_impl_data._M_start;
    if ((int)uVar5 < (int)(uVar8 >> 5)) break;
    std::vector<mg_server_port,_std::allocator<mg_server_port>_>::resize
              (__return_storage_ptr__,(long)uVar8 >> 4);
  }
  __new_size = 0;
  if (0 < (int)uVar5) {
    __new_size = (size_type)uVar5;
  }
  std::vector<mg_server_port,_std::allocator<mg_server_port>_>::resize
            (__return_storage_ptr__,__new_size);
  return __return_storage_ptr__;
}

Assistant:

std::vector<struct mg_server_port>
CivetServer::getListeningPortsFull()
{
	std::vector<struct mg_server_port> server_ports(8);
	for (;;) {
		int size = mg_get_server_ports(context,
		                               static_cast<int>(server_ports.size()),
		                               &server_ports[0]);
		if (size < static_cast<int>(server_ports.size())) {
			server_ports.resize(size < 0 ? 0 : size);
			break;
		}
		server_ports.resize(server_ports.size() * 2);
	}
	return server_ports;
}